

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

BOOL list_overlap(List *l1,List *l2)

{
  BOOL BVar1;
  
  if (l1 != (List *)0x0 && l2 != (List *)0x0) {
    do {
      if (l1 == l2) {
        return TRUE;
      }
      BVar1 = list_overlap(l1,l2->car);
      if (BVar1 != FALSE) {
        return TRUE;
      }
      BVar1 = list_overlap(l1,l2->cdr);
      if (BVar1 != FALSE) {
        return TRUE;
      }
      BVar1 = list_overlap(l1->car,l2);
      if (BVar1 != FALSE) {
        return TRUE;
      }
      l1 = l1->cdr;
    } while (l1 != (ListStruct *)0x0);
  }
  return FALSE;
}

Assistant:

BOOL
list_overlap (const List *l1, const List *l2)
{
  if (l1 == NULL || l2 == NULL)
    return FALSE;
  if (l1 == l2)
    return TRUE;
  return (list_overlap (l1, l2->car)
	  || list_overlap (l1, l2->cdr)
	  || list_overlap (l1->car, l2)
	  || list_overlap (l1->cdr, l2));
}